

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O3

void duckdb::TupleDataCollection::InitializeChunkState
               (TupleDataChunkState *chunk_state,vector<duckdb::LogicalType,_true> *types,
               vector<unsigned_long,_true> *column_ids)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  iterator __position;
  iterator __position_00;
  pointer puVar1;
  _Tuple_impl<0UL,_duckdb::VectorCache_*,_std::default_delete<duckdb::VectorCache>_> _Var2;
  vector<unsigned_long,_true> *pvVar3;
  bool bVar4;
  const_reference type;
  Allocator *allocator;
  _Head_base<0UL,_duckdb::VectorCache_*,_false> _Var5;
  reference this_00;
  type cache;
  size_type *psVar6;
  pointer *__ptr;
  size_type *psVar7;
  LogicalType cast_type;
  _Tuple_impl<0UL,_duckdb::VectorCache_*,_std::default_delete<duckdb::VectorCache>_> local_68;
  vector<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>,std::allocator<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>>
  *local_60;
  vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
  *local_58;
  vector<unsigned_long,_true> *local_50;
  undefined1 *local_48 [3];
  
  if ((column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GetAllColumnIDsInternal
              (column_ids,
               ((long)(types->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(types->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  InitializeVectorFormat(&chunk_state->vector_data,types);
  local_58 = (vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
              *)&chunk_state->cached_cast_vectors;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ::_M_erase_at_end((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_58,
                    (chunk_state->cached_cast_vectors).
                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_60 = (vector<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>,std::allocator<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>>
              *)&chunk_state->cached_cast_vector_cache;
  ::std::
  vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
  ::_M_erase_at_end((vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
                     *)local_60,
                    (chunk_state->cached_cast_vector_cache).
                    super_vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  psVar7 = (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar6 = (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar3 = column_ids;
  if (psVar7 != psVar6) {
    do {
      local_50 = pvVar3;
      type = vector<duckdb::LogicalType,_true>::operator[](types,*psVar7);
      local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl._0_1_ = 0x6c;
      local_48[0] = (undefined1 *)&local_68;
      bVar4 = TypeVisitor::
              Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                        (type,(anon_class_8_1_50811320 *)local_48);
      if (bVar4) {
        ArrayType::ConvertToList((LogicalType *)local_48,type);
        allocator = Allocator::DefaultAllocator();
        _Var5._M_head_impl = (VectorCache *)operator_new(0x10);
        VectorCache::VectorCache(_Var5._M_head_impl,allocator,(LogicalType *)local_48,0x800);
        local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::VectorCache_*,_false>)
             (_Head_base<0UL,_duckdb::VectorCache_*,_false>)_Var5._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>,std::allocator<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>
                  (local_60,(unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>
                             *)&local_68);
        _Var2.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl =
             local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl;
        if (local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl !=
            (VectorCache *)0x0) {
          this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl +
                 8))->_M_pi;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          operator_delete((void *)_Var2.super__Head_base<0UL,_duckdb::VectorCache_*,_false>.
                                  _M_head_impl);
        }
        this_00 = vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_true>
                  ::back((vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_true>
                          *)local_60);
        cache = unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>::
                operator*(this_00);
        _Var5._M_head_impl = (VectorCache *)operator_new(0x68);
        Vector::Vector((Vector *)_Var5._M_head_impl,cache);
        local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::VectorCache_*,_false>)
             (_Head_base<0UL,_duckdb::VectorCache_*,_false>)_Var5._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
        ::emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                  (local_58,(unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *
                            )&local_68);
        if (local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl !=
            (VectorCache *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_68,
                     (Vector *)
                     local_68.super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl);
        }
        LogicalType::~LogicalType((LogicalType *)local_48);
      }
      else {
        __position._M_current =
             (chunk_state->cached_cast_vectors).
             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (chunk_state->cached_cast_vectors).
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::_M_realloc_insert<>
                    ((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                      *)local_58,__position);
        }
        else {
          ((__position._M_current)->
          super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
          super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
          super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
          (chunk_state->cached_cast_vectors).
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        __position_00._M_current =
             (chunk_state->cached_cast_vector_cache).
             super_vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (chunk_state->cached_cast_vector_cache).
            super_vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
          ::_M_realloc_insert<>
                    ((vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
                      *)local_60,__position_00);
        }
        else {
          ((__position_00._M_current)->
          super_unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>_>)._M_t.
          super___uniq_ptr_impl<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>_>._M_t
          .super__Tuple_impl<0UL,_duckdb::VectorCache_*,_std::default_delete<duckdb::VectorCache>_>.
          super__Head_base<0UL,_duckdb::VectorCache_*,_false>._M_head_impl = (VectorCache *)0x0;
          (chunk_state->cached_cast_vector_cache).
          super_vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
      }
      psVar7 = psVar7 + 1;
      pvVar3 = local_50;
    } while (psVar7 != psVar6);
    psVar7 = (local_50->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar6 = (local_50->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    column_ids = local_50;
  }
  puVar1 = (chunk_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (chunk_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = psVar7;
  (chunk_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = psVar6;
  (chunk_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  return;
}

Assistant:

void TupleDataCollection::InitializeChunkState(TupleDataChunkState &chunk_state, const vector<LogicalType> &types,
                                               vector<column_t> column_ids) {
	if (column_ids.empty()) {
		GetAllColumnIDsInternal(column_ids, types.size());
	}
	InitializeVectorFormat(chunk_state.vector_data, types);

	chunk_state.cached_cast_vectors.clear();
	chunk_state.cached_cast_vector_cache.clear();
	for (auto &col : column_ids) {
		auto &type = types[col];
		if (TypeVisitor::Contains(type, LogicalTypeId::ARRAY)) {
			auto cast_type = ArrayType::ConvertToList(type);
			chunk_state.cached_cast_vector_cache.push_back(
			    make_uniq<VectorCache>(Allocator::DefaultAllocator(), cast_type));
			chunk_state.cached_cast_vectors.push_back(make_uniq<Vector>(*chunk_state.cached_cast_vector_cache.back()));
		} else {
			chunk_state.cached_cast_vectors.emplace_back();
			chunk_state.cached_cast_vector_cache.emplace_back();
		}
	}

	chunk_state.column_ids = std::move(column_ids);
}